

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DonateStrategy.cpp
# Opt level: O2

void __thiscall xmrig::DonateStrategy::setState(DonateStrategy *this,State state)

{
  State SVar1;
  uint64_t timeout;
  Timer *this_00;
  double min;
  double max;
  
  SVar1 = this->m_state;
  if (SVar1 == state) {
switchD_0017c8a7_default:
    return;
  }
  this->m_state = state;
  switch(state) {
  case STATE_IDLE:
    if (SVar1 != STATE_CONNECT) {
      if (SVar1 == STATE_NEW) {
        min = 0.5;
        max = 1.5;
      }
      else {
        (*this->m_strategy->_vptr_IStrategy[7])();
        if (this->m_proxy != (IClient *)0x0) {
          (*this->m_proxy->_vptr_IClient[0x13])();
          this->m_proxy = (IClient *)0x0;
        }
        min = 0.8;
        max = 1.2;
      }
      idle(this,min,max);
      return;
    }
    this_00 = this->m_timer;
    timeout = 20000;
    break;
  case STATE_CONNECT:
    (*(this->super_IStrategy)._vptr_IStrategy[5])(this);
    return;
  case STATE_ACTIVE:
    timeout = this->m_donateTime;
    this_00 = this->m_timer;
    break;
  case STATE_WAIT:
    this->m_timestamp = this->m_now + 3000;
    (*this->m_listener->_vptr_IStrategyListener[5])(this->m_listener,this);
    return;
  default:
    goto switchD_0017c8a7_default;
  }
  Timer::start(this_00,timeout,0);
  return;
}

Assistant:

void xmrig::DonateStrategy::setState(State state)
{
    constexpr const uint64_t waitTime = 3000;

    assert(m_state != state && state != STATE_NEW);
    if (m_state == state) {
        return;
    }

    const State prev = m_state;
    m_state = state;

    switch (state) {
    case STATE_NEW:
        break;

    case STATE_IDLE:
        if (prev == STATE_NEW) {
            idle(0.5, 1.5);
        }
        else if (prev == STATE_CONNECT) {
            m_timer->start(20000, 0);
        }
        else {
            m_strategy->stop();
            if (m_proxy) {
                m_proxy->deleteLater();
                m_proxy = nullptr;
            }

            idle(0.8, 1.2);
        }
        break;

    case STATE_CONNECT:
        connect();
        break;

    case STATE_ACTIVE:
        m_timer->start(m_donateTime, 0);
        break;

    case STATE_WAIT:
        m_timestamp = m_now + waitTime;
        m_listener->onPause(this);
        break;
    }
}